

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesPrimSemantics_Test::
~CppMetadataTest_AnnotatesPrimSemantics_Test(CppMetadataTest_AnnotatesPrimSemantics_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesPrimSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kPrimFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "ifield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_ifield" || *substring == "clear_ifield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    }
  }
  field_path.back() = 1;
  annotations.clear();
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "rifield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_rifield" || *substring == "clear_rifield" ||
               *substring == "add_rifield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_rifield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}